

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<unsigned_int,_int>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_int,_int> *this,uint value,bool is_valid)

{
  idx_t iVar1;
  bool bVar2;
  uint uVar3;
  
  iVar1 = this->compression_buffer_idx;
  this->compression_buffer_validity[iVar1] = is_valid;
  this->all_valid = (bool)(this->all_valid & is_valid);
  this->all_invalid = (bool)(this->all_invalid & !is_valid);
  if (is_valid) {
    this->compression_buffer[iVar1] = value;
    uVar3 = this->minimum;
    if (value <= this->minimum) {
      uVar3 = value;
    }
    this->minimum = uVar3;
    if (value < this->maximum) {
      value = this->maximum;
    }
    this->maximum = value;
  }
  this->compression_buffer_idx = iVar1 + 1;
  if (iVar1 + 1 == 0x800) {
    bVar2 = Flush<duckdb::EmptyBitpackingWriter>(this);
    this->minimum = 0xffffffff;
    this->minimum_delta = 0x7fffffff;
    this->maximum = 0;
    this->min_max_diff = 0;
    this->maximum_delta = -0x80000000;
    this->min_max_delta_diff = 0;
    this->delta_offset = 0;
    this->all_valid = true;
    this->all_invalid = true;
    this->can_do_delta = false;
    this->can_do_for = false;
    this->compression_buffer_idx = 0;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}